

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-while-connecting.c
# Opt level: O0

int run_test_tcp_close_while_connecting(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int r;
  uv_loop_t *loop;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("1.2.3.4",0x23a3,(sockaddr_in *)&loop);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
            ,0x48,"0 == uv_ip4_addr(\"1.2.3.4\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_tcp_init(puVar2,&tcp_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
            ,0x49,"0 == uv_tcp_init(loop, &tcp_handle)");
    abort();
  }
  iVar1 = uv_tcp_connect((uv_connect_t *)addr.sin_zero,&tcp_handle,(sockaddr *)&loop,connect_cb);
  if (iVar1 == -0x65) {
    fprintf(_stderr,"%s\n","Network unreachable.");
    fflush(_stderr);
    connect_req.queue[1]._4_4_ = 1;
  }
  else {
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x50,"r == 0");
      abort();
    }
    iVar1 = uv_timer_init(puVar2,&timer1_handle);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x51,"0 == uv_timer_init(loop, &timer1_handle)");
      abort();
    }
    iVar1 = uv_timer_start(&timer1_handle,timer1_cb,1,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x52,"0 == uv_timer_start(&timer1_handle, timer1_cb, 1, 0)");
      abort();
    }
    iVar1 = uv_timer_init(puVar2,&timer2_handle);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x53,"0 == uv_timer_init(loop, &timer2_handle)");
      abort();
    }
    iVar1 = uv_timer_start(&timer2_handle,timer2_cb,86400000,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x54,"0 == uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0)");
      abort();
    }
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x55,"0 == uv_run(loop, UV_RUN_DEFAULT)");
      abort();
    }
    if (connect_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x57,"connect_cb_called == 1");
      abort();
    }
    if (timer1_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x58,"timer1_cb_called == 1");
      abort();
    }
    if (close_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x59,"close_cb_called == 2");
      abort();
    }
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-while-connecting.c"
              ,0x5b,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    if (netunreach_errors < 1) {
      connect_req.queue[1]._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"%s\n","Network unreachable.");
      fflush(_stderr);
      connect_req.queue[1]._4_4_ = 1;
    }
  }
  return connect_req.queue[1]._4_4_;
}

Assistant:

TEST_IMPL(tcp_close_while_connecting) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("1.2.3.4", TEST_PORT, &addr));
  ASSERT(0 == uv_tcp_init(loop, &tcp_handle));
  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);
  ASSERT(0 == uv_timer_init(loop, &timer1_handle));
  ASSERT(0 == uv_timer_start(&timer1_handle, timer1_cb, 1, 0));
  ASSERT(0 == uv_timer_init(loop, &timer2_handle));
  ASSERT(0 == uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(connect_cb_called == 1);
  ASSERT(timer1_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();

  if (netunreach_errors > 0)
    RETURN_SKIP("Network unreachable.");

  return 0;
}